

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  list<int,_std::allocator<int>_> *end;
  int iVar1;
  ostream *poVar2;
  _List_node_base *p_Var3;
  int iVar4;
  int iVar5;
  bool bVar6;
  params arguments;
  solution sol;
  params local_170;
  solution local_148;
  
  params::params(&local_170,argc,argv);
  if (local_170.help_required == true) {
    poVar2 = operator<<((ostream *)&std::cout,(help_type *)&params::help);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  else {
    end = &local_170.capacities;
    if (local_170.measure == 0) {
      if (local_170.capacities.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
          super__List_node_base._M_next == (_List_node_base *)end) {
        solution::solution<std::_List_const_iterator<int>>
                  (&local_148,
                   (_List_const_iterator<int>)
                   local_170.capacities.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                   super__List_node_base._M_next,(_List_const_iterator<int>)end);
      }
      else {
        p_Var3 = local_170.capacities.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                 super__List_node_base._M_next;
        iVar4 = 0;
        do {
          iVar5 = iVar4;
          iVar1 = *(int *)&p_Var3[1]._M_next;
          iVar4 = iVar5 + iVar1;
          p_Var3 = p_Var3->_M_next;
        } while (p_Var3 != (_List_node_base *)end);
        solution::solution<std::_List_const_iterator<int>>
                  (&local_148,
                   (_List_const_iterator<int>)
                   local_170.capacities.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                   super__List_node_base._M_next,(_List_const_iterator<int>)end);
        if (0 < iVar4) {
          iVar4 = 1;
          do {
            solution::find_solution(&local_148,iVar4,local_170.max_steps);
            poVar2 = operator<<((ostream *)&std::cout,&local_148);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
            std::ostream::put((char)poVar2);
            std::ostream::flush();
            bVar6 = iVar4 != iVar1 + iVar5;
            iVar4 = iVar4 + 1;
          } while (bVar6);
        }
      }
    }
    else {
      solution::solution<std::_List_const_iterator<int>>
                (&local_148,
                 (_List_const_iterator<int>)
                 local_170.capacities.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                 super__List_node_base._M_next,(_List_const_iterator<int>)end);
      solution::find_solution(&local_148,local_170.measure,local_170.max_steps);
      poVar2 = operator<<((ostream *)&std::cout,&local_148);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
              (&local_148.steps_ixes.
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Deque_base<step,_std::allocator<step>_>::~_Deque_base
              (&local_148.current_steps.super__Deque_base<step,_std::allocator<step>_>);
    std::_Deque_base<step,_std::allocator<step>_>::~_Deque_base
              (&local_148.possible_steps.super__Deque_base<step,_std::allocator<step>_>);
    std::vector<bucket,_std::allocator<bucket>_>::~vector(&local_148.buckets);
  }
  while (local_170.capacities.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
         super__List_node_base._M_next != (_List_node_base *)&local_170.capacities) {
    p_Var3 = (local_170.capacities.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
              super__List_node_base._M_next)->_M_next;
    operator_delete(local_170.capacities.super__List_base<int,_std::allocator<int>_>._M_impl._M_node
                    .super__List_node_base._M_next,0x18);
    local_170.capacities.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var3;
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	int rc = EXIT_SUCCESS;

	try {
		const params arguments{argc, argv};
		if (arguments.help_required)
			std::cout << params::help << std::endl;
		else
			find_solutions(arguments);
	}
	catch (const std::exception& e) {
		std::cerr << "\nError: " << e.what() << std::endl;
		rc = EXIT_FAILURE;
	}

	return rc;
}